

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-gl.c
# Opt level: O0

Result host_gl_shader(GLenum type,GLchar *source,GLuint *out_shader)

{
  GLuint GVar1;
  uint uVar2;
  GLchar *pGVar3;
  char *pcVar4;
  GLchar *log;
  GLint length;
  GLint status;
  GLchar *sources [2];
  char version [128];
  GLuint shader;
  GLuint *out_shader_local;
  GLchar *source_local;
  GLenum type_local;
  
  if ((type != 0x8b31) && (type != 0x8b30)) {
    __assert_fail("type == GL_VERTEX_SHADER || type == GL_FRAGMENT_SHADER",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host-gl.c",
                  0x28,"Result host_gl_shader(GLenum, const GLchar *, GLuint *)");
  }
  GVar1 = (*glCreateShader)(type);
  uVar2 = host_gl_shader_version();
  snprintf((char *)(sources + 1),0x7f,"#version %d\n",(ulong)uVar2);
  _length = sources + 1;
  sources[0] = source;
  (*glShaderSource)(GVar1,2,(GLchar **)&length,(GLint *)0x0);
  (*glCompileShader)(GVar1);
  (*glGetShaderiv)(GVar1,0x8b81,(GLint *)((long)&log + 4));
  if (log._4_4_ == 0) {
    (*glGetShaderiv)(GVar1,0x8b84,(GLint *)&log);
    pGVar3 = (GLchar *)malloc((long)((int)log + 1));
    (*glGetShaderInfoLog)(GVar1,(int)log,(GLsizei *)0x0,pGVar3);
    pcVar4 = "GL_FRAGMENT_SHADER";
    if (type == 0x8b31) {
      pcVar4 = "GL_VERTEX_SHADER";
    }
    fprintf(_stderr,"%s ERROR: %s\n",pcVar4,pGVar3);
    source_local._4_4_ = ERROR;
  }
  else {
    *out_shader = GVar1;
    source_local._4_4_ = OK;
  }
  return source_local._4_4_;
}

Assistant:

Result host_gl_shader(GLenum type, const GLchar* source, GLuint* out_shader) {
  assert(type == GL_VERTEX_SHADER || type == GL_FRAGMENT_SHADER);
  GLuint shader = glCreateShader(type);
  char version[128];
  snprintf(version, sizeof(version) - 1, "#version %d\n",
           host_gl_shader_version());
  const GLchar* sources[] = {version, source};
  glShaderSource(shader, 2, sources, NULL);
  glCompileShader(shader);
  CHECK_LOG(shader, Shader, GL_COMPILE_STATUS, type == GL_VERTEX_SHADER
                                                   ? "GL_VERTEX_SHADER"
                                                   : "GL_FRAGMENT_SHADER");
  *out_shader = shader;
  return OK;
  ON_ERROR_RETURN;
}